

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_25095d::FunctionEncoding::printRight(FunctionEncoding *this,OutputStream *S)

{
  Node *pNVar1;
  Qualifiers QVar2;
  char *pcVar3;
  char *pcVar4;
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  StringView R_03;
  StringView R_04;
  
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  NodeArray::printWithComma(&this->Params,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  pNVar1 = this->Ret;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  QVar2 = this->CVQuals;
  if ((QVar2 & QualConst) != QualNone) {
    R_01.Last = "";
    R_01.First = " const";
    OutputStream::operator+=(S,R_01);
    QVar2 = this->CVQuals;
  }
  if ((QVar2 & QualVolatile) != QualNone) {
    R_02.Last = "";
    R_02.First = " volatile";
    OutputStream::operator+=(S,R_02);
    QVar2 = this->CVQuals;
  }
  if ((QVar2 & QualRestrict) != QualNone) {
    R_03.Last = "";
    R_03.First = " restrict";
    OutputStream::operator+=(S,R_03);
  }
  if (this->RefQual == FrefQualRValue) {
    pcVar4 = " &&";
    pcVar3 = "";
  }
  else {
    if (this->RefQual != FrefQualLValue) goto LAB_0017c0fd;
    pcVar4 = " &";
    pcVar3 = "";
  }
  R_04.Last = pcVar3;
  R_04.First = pcVar4;
  OutputStream::operator+=(S,R_04);
LAB_0017c0fd:
  if (this->Attrs != (Node *)0x0) {
    Node::print(this->Attrs,S);
    return;
  }
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    S += "(";
    Params.printWithComma(S);
    S += ")";
    if (Ret)
      Ret->printRight(S);

    if (CVQuals & QualConst)
      S += " const";
    if (CVQuals & QualVolatile)
      S += " volatile";
    if (CVQuals & QualRestrict)
      S += " restrict";

    if (RefQual == FrefQualLValue)
      S += " &";
    else if (RefQual == FrefQualRValue)
      S += " &&";

    if (Attrs != nullptr)
      Attrs->print(S);
  }